

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.h
# Opt level: O0

bool __thiscall pbrt::RGBColorSpace::operator==(RGBColorSpace *this,RGBColorSpace *cs)

{
  bool bVar1;
  Point2<float> *in_RSI;
  Tuple2<pbrt::Point2,_float> *in_RDI;
  bool local_11;
  
  bVar1 = Tuple2<pbrt::Point2,_float>::operator==(in_RDI,in_RSI);
  local_11 = false;
  if (bVar1) {
    bVar1 = Tuple2<pbrt::Point2,_float>::operator==(in_RDI + 1,in_RSI + 1);
    local_11 = false;
    if (bVar1) {
      bVar1 = Tuple2<pbrt::Point2,_float>::operator==(in_RDI + 2,in_RSI + 2);
      local_11 = false;
      if (bVar1) {
        bVar1 = Tuple2<pbrt::Point2,_float>::operator==(in_RDI + 3,in_RSI + 3);
        local_11 = false;
        if (bVar1) {
          local_11 = in_RDI[0x12] == in_RSI[0x12].super_Tuple2<pbrt::Point2,_float>;
        }
      }
    }
  }
  return local_11;
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const RGBColorSpace &cs) const {
        return (r == cs.r && g == cs.g && b == cs.b && w == cs.w &&
                rgbToSpectrumTable == cs.rgbToSpectrumTable);
    }